

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::ValidateTestPropertyName
               (string *property_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reserved_names)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  pointer pbVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (reserved_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,property_name);
  pbVar7 = (reserved_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (_Var1._M_current != pbVar7) {
    Message::Message((Message *)&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_68.ptr_ + 0x10),"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_68.ptr_ + 0x10),(property_name->_M_dataplus)._M_p,
               property_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_68.ptr_ + 0x10)," (",2);
    local_60 = pbVar7;
    local_58 = _Var1._M_current;
    Message::Message((Message *)&local_70);
    pbVar3 = (reserved_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (reserved_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pbVar2 - (long)pbVar3 != 0) {
      uVar4 = (long)pbVar2 - (long)pbVar3 >> 5;
      lVar6 = 8;
      uVar5 = 0;
      do {
        if (2 < uVar4 && uVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_70.data_)->line,", ",2);
          pbVar3 = (reserved_names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (reserved_names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        if (uVar5 == ((long)pbVar2 - (long)pbVar3 >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_70.data_)->line,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_70.data_)->line,"\'",1);
        pbVar3 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_70.data_)->line,*(char **)((long)pbVar3 + lVar6 + -8),
                   *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_70.data_)->line,"\'",1);
        uVar5 = uVar5 + 1;
        pbVar3 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (reserved_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar4 = (long)pbVar2 - (long)pbVar3 >> 5;
        lVar6 = lVar6 + 0x20;
      } while (uVar5 < uVar4);
    }
    internal::StringStreamToString(&local_50,(stringstream *)local_70.data_);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_70.data_ + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_68.ptr_ + 0x10),local_50._M_dataplus._M_p,local_50._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_68.ptr_ + 0x10)," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_68.ptr_ + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_68.ptr_ + 0x10),")",1);
    internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest.cc"
               ,0x71e,"Failed");
    _Var1._M_current = local_58;
    pbVar7 = local_60;
    internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68.ptr_ + 8))();
    }
  }
  return _Var1._M_current == pbVar7;
}

Assistant:

bool ValidateTestPropertyName(const std::string& property_name,
                              const std::vector<std::string>& reserved_names) {
  if (std::find(reserved_names.begin(), reserved_names.end(), property_name) !=
          reserved_names.end()) {
    ADD_FAILURE() << "Reserved key used in RecordProperty(): " << property_name
                  << " (" << FormatWordList(reserved_names)
                  << " are reserved by " << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}